

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3Codec.cpp
# Opt level: O0

int __thiscall AC3Codec::decodeFrame(AC3Codec *this,uint8_t *buf,uint8_t *end,int *skipBytes)

{
  undefined1 auVar1 [16];
  bool bVar2;
  AC3ParseError AVar3;
  long lVar4;
  uint8_t *buff;
  byte *pbVar5;
  BitStreamException *anon_var_0;
  uint8_t *nextFrame;
  int trueHDFrameLen;
  uint8_t *trueHDData_1;
  uint8_t *trueHDData;
  AC3ParseError err;
  int local_34;
  int rez;
  int *skipBytes_local;
  uint8_t *end_local;
  uint8_t *buf_local;
  AC3Codec *this_local;
  
  local_34 = 0;
  if ((long)end - (long)buf < 2) {
    return -10;
  }
  if ((((this->m_state != stateDecodeAC3) && (*buf == '\v')) && (buf[1] == 'w')) &&
     (bVar2 = testDecodeTestFrame(this,buf,end), bVar2)) {
    this->m_state = stateDecodeAC3;
  }
  if (this->m_state == stateDecodeAC3) {
    *skipBytes = 0;
    AVar3 = parseHeader(this,buf,end);
    if (AVar3 == NOT_ENOUGH_BUFFER) {
      return -10;
    }
    if (AVar3 != NO_ERROR) {
      return 0;
    }
    lVar4 = (long)this->m_samples;
    auVar1._8_8_ = lVar4 / 0x67e262b4 + (lVar4 >> 0x3f);
    auVar1._0_8_ = lVar4 * 0x13b6d8300;
    this->m_frameDuration = SUB168(auVar1 / SEXT816((long)this->m_sample_rate),0);
    local_34 = this->m_frame_size;
  }
  bVar2 = getTestMode(this);
  if ((bVar2) && ((this->m_true_hd_mode & 1U) == 0)) {
    buff = buf + local_34;
    if ((long)end - (long)buff < 8) {
      return -10;
    }
    bVar2 = isSyncWord(buff);
    if ((!bVar2) && (bVar2 = isHDSyncWord(buff + 4), bVar2)) {
      if ((long)end - (long)buff < 0x15) {
        return -10;
      }
      bVar2 = MLPCodec::decodeFrame(&this->mlp,buff,buff + 0x15);
      this->m_true_hd_mode = bVar2;
    }
  }
  if ((this->m_true_hd_mode & 1U) == 0) {
    if (((this->m_downconvertToAC3 & 1U) == 0) || (this->m_bsid < 0xb)) {
      this_local._4_4_ = local_34;
    }
    else {
      *skipBytes = local_34;
      this_local._4_4_ = 0;
    }
  }
  else {
    pbVar5 = buf + local_34;
    if ((long)end - (long)pbVar5 < 7) {
      this_local._4_4_ = -10;
    }
    else if (this->m_state == stateDecodeAC3) {
      if (((*pbVar5 != 0xb) || (pbVar5[1] != 0x77)) ||
         (bVar2 = testDecodeTestFrame(this,pbVar5,end), !bVar2)) {
        this->m_waitMoreData = true;
        this->m_state = stateDecodeTrueHDFirst;
      }
      this_local._4_4_ = local_34;
    }
    else {
      this->m_state = stateDecodeTrueHD;
      this_local._4_4_ = ((uint)pbVar5[1] + (*pbVar5 & 0xf) * 0x100) * 2;
      if ((long)end - (long)pbVar5 < (long)this_local._4_4_) {
        this_local._4_4_ = -10;
      }
      else {
        if ((this->m_true_hd_mode & 1U) == 0) {
          bVar2 = MLPCodec::decodeFrame(&this->mlp,pbVar5,pbVar5 + this_local._4_4_);
          this->m_true_hd_mode = bVar2;
        }
        pbVar5 = pbVar5 + this_local._4_4_;
        if (((*pbVar5 == 0xb) && (pbVar5[1] == 0x77)) &&
           (bVar2 = testDecodeTestFrame(this,pbVar5,end), bVar2)) {
          this->m_waitMoreData = false;
        }
        if ((this->m_downconvertToAC3 & 1U) != 0) {
          *skipBytes = this_local._4_4_;
          this_local._4_4_ = 0;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int AC3Codec::decodeFrame(uint8_t *buf, uint8_t *end, int &skipBytes)
{
    try
    {
        int rez = 0;

        if (end - buf < 2)
            return NOT_ENOUGH_BUFFER;
        if (m_state != AC3State::stateDecodeAC3 && buf[0] == 0x0B && buf[1] == 0x77)
        {
            if (testDecodeTestFrame(buf, end))
                m_state = AC3State::stateDecodeAC3;
        }

        if (m_state == AC3State::stateDecodeAC3)
        {
            skipBytes = 0;
            const AC3ParseError err = parseHeader(buf, end);

            if (err == AC3ParseError::NOT_ENOUGH_BUFFER)
                return NOT_ENOUGH_BUFFER;

            if (err != AC3ParseError::NO_ERROR)
                return 0;  // parse error

            m_frameDuration = (INTERNAL_PTS_FREQ * m_samples) / m_sample_rate;
            rez = m_frame_size;
        }

        if (getTestMode() && !m_true_hd_mode)
        {
            uint8_t *trueHDData = buf + rez;
            if (end - trueHDData < 8)
                return NOT_ENOUGH_BUFFER;
            if (!isSyncWord(trueHDData) && isHDSyncWord(trueHDData + 4))
            {
                if (end - trueHDData < 21)
                    return NOT_ENOUGH_BUFFER;
                m_true_hd_mode = mlp.decodeFrame(trueHDData, trueHDData + 21);
            }
        }

        if ((m_true_hd_mode))  // omit AC3+
        {
            uint8_t *trueHDData = buf + rez;
            if (end - trueHDData < 7)
                return NOT_ENOUGH_BUFFER;
            if (m_state == AC3State::stateDecodeAC3)
            {
                // check if it is a real HD frame

                if (trueHDData[0] != 0x0B || trueHDData[1] != 0x77 || !testDecodeTestFrame(trueHDData, end))
                {
                    m_waitMoreData = true;
                    m_state = AC3State::stateDecodeTrueHDFirst;
                }
                return rez;
            }
            m_state = AC3State::stateDecodeTrueHD;
            int trueHDFrameLen = (trueHDData[0] & 0x0f) << 8;
            trueHDFrameLen += trueHDData[1];
            trueHDFrameLen *= 2;
            if (end - trueHDData < static_cast<int64_t>(trueHDFrameLen))
                return NOT_ENOUGH_BUFFER;
            if (!m_true_hd_mode)
            {
                m_true_hd_mode = mlp.decodeFrame(trueHDData, trueHDData + trueHDFrameLen);
            }
            uint8_t *nextFrame = trueHDData + trueHDFrameLen;

            if (nextFrame[0] == 0x0B && nextFrame[1] == 0x77 && testDecodeTestFrame(nextFrame, end))
                m_waitMoreData = false;

            if (m_downconvertToAC3)
            {
                skipBytes = trueHDFrameLen;
                return 0;
            }
            return trueHDFrameLen;
        }
        if (m_downconvertToAC3 && m_bsid > 10)
        {
            skipBytes = rez;  // skip E-AC3 frame
            return 0;
        }
        return rez;
    }
    catch (BitStreamException &)
    {
        return NOT_ENOUGH_BUFFER;
    }
}